

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmElseIfCommand.cxx
# Opt level: O3

bool __thiscall
cmElseIfCommand::InitialPass
          (cmElseIfCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "An ELSEIF command was found outside of a proper IF ENDIF structure.","");
  cmCommand::SetError(&this->super_cmCommand,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmElseIfCommand::InitialPass(std::vector<std::string> const&,
                                  cmExecutionStatus &)
{
  this->SetError("An ELSEIF command was found outside of a proper "
                 "IF ENDIF structure.");
  return false;
}